

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O1

void __thiscall dg::pta::PointerAnalysis::queue_changed(PointerAnalysis *this)

{
  pointer ppPVar1;
  ulong uVar2;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> local_30;
  
  ppPVar1 = (this->to_process).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar2 = (long)(this->to_process).
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppPVar1;
  if (uVar2 != 0) {
    (this->to_process).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppPVar1;
  }
  if ((this->changed).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->changed).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    PointerGraph::getNodes<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>
              (&local_30,this->PG,&this->changed,true,(uint)(uVar2 >> 3));
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::_M_move_assign
              (&this->to_process,&local_30);
    if (local_30.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.
                      super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_30.
                            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.
                            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    ppPVar1 = (this->changed).
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->changed).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppPVar1) {
      (this->changed).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppPVar1;
    }
  }
  return;
}

Assistant:

void queue_changed() {
        unsigned last_processed_num = to_process.size();
        to_process.clear();

        if (!changed.empty()) {
            // DONT std::move - it prevents compiler from copy ellision
            to_process = PG->getNodes(changed /* starting set */,
                                      true /* interprocedural */,
                                      last_processed_num /* expected num */);

            // since changed was not empty,
            // the to_process must not be empty too
            assert(!to_process.empty());
            assert(to_process.size() >= changed.size());
            changed.clear();
        }
    }